

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cxx
# Opt level: O3

void showTime(OledPixel *pixels)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  time_t now;
  time_t local_28;
  
  (*pixels->_vptr_OledPixel[2])();
  time(&local_28);
  ptVar3 = localtime(&local_28);
  iVar4 = ptVar3->tm_hour;
  auVar8._0_8_ = (double)(int)(iVar4 + (((uint)(iVar4 / 6 + (iVar4 >> 0x1f)) >> 1) - (iVar4 >> 0x1f)
                                       ) * -0xc);
  auVar8._8_8_ = (double)ptVar3->tm_min;
  auVar8 = divpd(auVar8,_DAT_00108040);
  dVar5 = (double)ptVar3->tm_sec / 60.0;
  drawHand(auVar8._8_8_ / 12.0 + auVar8._0_8_,0x12,pixels);
  drawHand(dVar5 / 60.0 + auVar8._8_8_,0x1c,pixels);
  drawHand(dVar5,0x1e,pixels);
  dVar5 = 0.0;
  iVar4 = 0xc;
  do {
    dVar6 = (dVar5 * 3.141592653589793) / 6.0;
    dVar7 = sin(dVar6);
    iVar1 = (*pixels->_vptr_OledPixel[8])(pixels);
    dVar6 = cos(dVar6);
    iVar2 = (*pixels->_vptr_OledPixel[9])(pixels);
    (*pixels->_vptr_OledPixel[5])
              (pixels,CONCAT44(iVar2 / 2 + (int)(dVar6 * 31.0),iVar1 / 2 + (int)(dVar7 * 31.0)));
    dVar5 = dVar5 + 1.0;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void
showTime(
    SSD1306::OledPixel& pixels)
{
    //---------------------------------------------------------------------

    pixels.clear();

    //---------------------------------------------------------------------

    time_t now;
    time(&now);
    struct tm* tm = localtime(&now);

    //---------------------------------------------------------------------

    auto hour = (tm->tm_hour % 12) / 12.0;
    auto minute = tm->tm_min / 60.0;
    auto second = tm->tm_sec / 60.0;

    drawHand(hour + (minute / 12.0), HourHandLength, pixels);
    drawHand(minute + (second / 60.0), MinuteHandLength, pixels);
    drawHand(second, SecondHandLength, pixels);

    //---------------------------------------------------------------------

    for (auto tick = 0 ; tick < 12 ; ++tick)
    {
        auto radians = tick * M_PI / 6.0;
        pixels.setPixel(
            SSD1306::OledPoint(int(sin(radians) * TickRadius) +
                               (pixels.width() / 2),
                               int(cos(radians) * TickRadius) +
                               (pixels.height() / 2)));
    }

    //---------------------------------------------------------------------
}